

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

void uv__stream_init(uv_loop_t *loop,uv_stream_t *stream,uv_handle_type type)

{
  long *plVar1;
  int iVar2;
  
  stream->loop = loop;
  stream->type = type;
  stream->flags = 8;
  stream->handle_queue[0] = loop->handle_queue;
  plVar1 = (long *)loop->handle_queue[1];
  stream->handle_queue[1] = plVar1;
  *plVar1 = (long)stream->handle_queue;
  loop->handle_queue[1] = stream->handle_queue;
  stream->next_closing = (uv_handle_t *)0x0;
  stream->close_cb = (uv_close_cb)0x0;
  stream->connection_cb = (uv_connection_cb)0x0;
  stream->alloc_cb = (uv_alloc_cb)0x0;
  stream->read_cb = (uv_read_cb)0x0;
  stream->connect_req = (uv_connect_t *)0x0;
  stream->shutdown_req = (uv_shutdown_t *)0x0;
  stream->queued_fds = (void *)0x0;
  stream->delayed_error = 0;
  stream->accepted_fd = -1;
  stream->write_queue[0] = stream->write_queue;
  stream->write_queue[1] = stream->write_queue;
  stream->write_completed_queue[0] = stream->write_completed_queue;
  stream->write_completed_queue[1] = stream->write_completed_queue;
  stream->write_queue_size = 0;
  if (loop->emfile_fd == -1) {
    iVar2 = uv__open_cloexec("/dev/null",0);
    if (iVar2 < 0) {
      iVar2 = uv__open_cloexec("/",0);
      if (iVar2 < 0) goto LAB_00114fc5;
    }
    loop->emfile_fd = iVar2;
  }
LAB_00114fc5:
  uv__io_init(&stream->io_watcher,uv__stream_io,-1);
  return;
}

Assistant:

void uv__stream_init(uv_loop_t* loop,
                     uv_stream_t* stream,
                     uv_handle_type type) {
  int err;

  uv__handle_init(loop, (uv_handle_t*)stream, type);
  stream->read_cb = NULL;
  stream->alloc_cb = NULL;
  stream->close_cb = NULL;
  stream->connection_cb = NULL;
  stream->connect_req = NULL;
  stream->shutdown_req = NULL;
  stream->accepted_fd = -1;
  stream->queued_fds = NULL;
  stream->delayed_error = 0;
  QUEUE_INIT(&stream->write_queue);
  QUEUE_INIT(&stream->write_completed_queue);
  stream->write_queue_size = 0;

  if (loop->emfile_fd == -1) {
    err = uv__open_cloexec("/dev/null", O_RDONLY);
    if (err < 0)
        /* In the rare case that "/dev/null" isn't mounted open "/"
         * instead.
         */
        err = uv__open_cloexec("/", O_RDONLY);
    if (err >= 0)
      loop->emfile_fd = err;
  }

#if defined(__APPLE__)
  stream->select = NULL;
#endif /* defined(__APPLE_) */

  uv__io_init(&stream->io_watcher, uv__stream_io, -1);
}